

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9HashmapValuesToSet(jx9_hashmap *pMap,SySet *pOut)

{
  jx9_vm *pjVar1;
  uint uVar2;
  jx9_hashmap_node *pNode;
  jx9_value *pValue;
  jx9_value *local_30;
  
  pNode = pMap->pFirst;
  pjVar1 = pMap->pVm;
  pOut->nUsed = 0;
  pOut->nSize = 0;
  pOut->eSize = 8;
  pOut->nCursor = 0;
  pOut->pAllocator = &pjVar1->sAllocator;
  pOut->pBase = (void *)0x0;
  pOut->pUserData = (void *)0x0;
  for (uVar2 = 0; uVar2 < pMap->nEntry; uVar2 = uVar2 + 1) {
    local_30 = HashmapExtractNodeValue(pNode);
    if (local_30 != (jx9_value *)0x0) {
      SySetPut(pOut,&local_30);
    }
    pNode = pNode->pPrev;
  }
  return pOut->nUsed;
}

Assistant:

JX9_PRIVATE int jx9HashmapValuesToSet(jx9_hashmap *pMap, SySet *pOut)
{
	jx9_hashmap_node *pEntry = pMap->pFirst;
	jx9_value *pValue;
	sxu32 n;
	/* Initialize the container */
	SySetInit(pOut, &pMap->pVm->sAllocator, sizeof(jx9_value *));
	for(n = 0 ; n < pMap->nEntry ; n++ ){
		/* Extract node value */
		pValue = HashmapExtractNodeValue(pEntry);
		if( pValue ){
			SySetPut(pOut, (const void *)&pValue);
		}
		/* Point to the next entry */
		pEntry = pEntry->pPrev; /* Reverse link */
	}
	/* Total inserted entries */
	return (int)SySetUsed(pOut);
}